

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::init_holder_helper
               (instance_type *inst,holder_type *holder_ptr,void *param_3)

{
  void *param_2_local;
  holder_type *holder_ptr_local;
  instance_type *inst_local;
  
  if (holder_ptr == (holder_type *)0x0) {
    if (((inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).
         field_0x20 & 1) != 0) {
      std::
      unique_ptr<CoreML::MilStoragePython::MilStoragePythonReader,std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>>
      ::unique_ptr<std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>,void>
                ((unique_ptr<CoreML::MilStoragePython::MilStoragePythonReader,std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>>
                  *)&inst->holder,
                 (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>)
                 .value);
      (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).field_0x20
           = (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).
             field_0x20 & 0xfd | 2;
    }
  }
  else {
    init_holder_from_existing(inst,holder_ptr);
    (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).field_0x20 =
         (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).
         field_0x20 & 0xfd | 2;
  }
  return;
}

Assistant:

static void init_holder_helper(instance_type *inst, const holder_type *holder_ptr, const void * /* dummy */) {
        if (holder_ptr) {
            init_holder_from_existing(inst, holder_ptr, std::is_copy_constructible<holder_type>());
            inst->holder_constructed = true;
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (&inst->holder) holder_type(inst->value);
            inst->holder_constructed = true;
        }
    }